

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::inertia::mark_bisection
          (inertia *this,CommPtr *comm,Reals *coords,Reals *masses,Real tolerance,Vector<3> *axis)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Real total_mass;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  Alloc *pAVar14;
  double dVar15;
  Vector<3> center_00;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined4 uVar19;
  uint uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  int iVar24;
  Int j_3;
  DiagDecomp<3> *pDVar25;
  double *pdVar26;
  ulong uVar27;
  long lVar28;
  size_t sVar29;
  double dVar30;
  long lVar31;
  undefined8 uVar32;
  uint uVar33;
  void *extraout_RDX;
  Int i_2;
  int iVar34;
  Vector<6> *pVVar35;
  DiagDecomp<3> *pDVar36;
  double *pdVar37;
  Matrix<3,_3> *pMVar38;
  ulong uVar39;
  long lVar40;
  Int j;
  long lVar41;
  Int i_1;
  long lVar42;
  Int i_26;
  Int i_20;
  ulong uVar43;
  byte bVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  element_type *peVar47;
  double dVar48;
  Alloc *pAVar49;
  uint uVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  Alloc *pAVar55;
  void *pvVar56;
  double dVar57;
  double dVar58;
  Alloc *pAVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  Real i_10;
  double dVar64;
  double dVar65;
  Read<signed_char> RVar66;
  double dStack_570;
  Vector<6> v;
  double local_508;
  undefined4 uStack_500;
  uint uStack_4fc;
  undefined8 local_4f8;
  double dStack_4d0;
  Vector<3> c_9;
  Write<signed_char> local_4a0;
  Write<signed_char> local_490;
  DiagDecomp<3> ed;
  Vector<3> c_7;
  Matrix<3,_3> c_1;
  Vector<3> c_5;
  char *local_358;
  double dStack_330;
  undefined4 local_328;
  undefined4 uStack_324;
  Write<double> local_2b8;
  Write<double> weighted_contrib;
  Vector<3> l;
  Write<double> local_270;
  Write<double> local_260;
  Vector<3> c_2;
  double local_228 [3];
  type f;
  Write<double> local_178;
  Write<double> local_168;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_158;
  Write<double> local_148;
  Write<double> local_138;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_128;
  Write<double> local_118;
  Write<double> local_108;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_f8;
  Write<double> local_e8;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_d8;
  Write<double> local_c8;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_b8;
  Vector<3> c_19;
  Vector<3> center;
  double local_78 [3];
  Vector<3> c_4;
  Vector<3> x;
  
  bVar44 = 0;
  pAVar49 = (coords->write_).shared_alloc_.alloc;
  if (((ulong)pAVar49 & 1) == 0) {
    uVar39 = pAVar49->size;
  }
  else {
    uVar39 = (ulong)pAVar49 >> 3;
  }
  pAVar49 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)pAVar49 & 1) == 0) {
    sVar29 = pAVar49->size;
  }
  else {
    sVar29 = (ulong)pAVar49 >> 3;
  }
  if ((int)(sVar29 >> 3) * 3 != (int)(uVar39 >> 3)) {
    fail("assertion %s failed at %s +%d\n","coords.size() == masses.size() * 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_inertia.cpp"
         ,0x91);
  }
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d8,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
  Write<double>::Write(&local_e8,&masses->write_);
  total_mass = repro_sum((CommPtr *)&local_d8,(Reals *)&local_e8);
  Write<double>::~Write(&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_f8,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
  Write<double>::Write(&local_108,&coords->write_);
  Write<double>::Write(&local_118,&masses->write_);
  anon_unknown_0::get_center
            (&center,(CommPtr *)&local_f8,(Reals *)&local_108,(Reals *)&local_118,total_mass);
  Write<double>::~Write(&local_118);
  Write<double>::~Write(&local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_128,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
  Write<double>::Write(&local_138,&coords->write_);
  Write<double>::Write(&local_148,&masses->write_);
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_b8,&local_128);
  Write<double>::Write(&local_c8,&local_138);
  Write<double>::Write(&local_2b8,&local_148);
  if (((ulong)local_2b8.shared_alloc_.alloc & 1) == 0) {
    uVar39 = (local_2b8.shared_alloc_.alloc)->size;
  }
  else {
    uVar39 = (ulong)local_2b8.shared_alloc_.alloc >> 3;
  }
  std::__cxx11::string::string((string *)&v,"",(allocator *)&ed);
  uVar33 = (uint)(uVar39 >> 3);
  Write<double>::Write(&weighted_contrib,uVar33 * 6,(string *)&v);
  std::__cxx11::string::~string((string *)&v);
  Write<double>::Write((Write<double> *)&f,&local_c8);
  f.center.super_Few<double,_3>.array_[2] = center.super_Few<double,_3>.array_[2];
  f.center.super_Few<double,_3>.array_[0] = center.super_Few<double,_3>.array_[0];
  f.center.super_Few<double,_3>.array_[1] = center.super_Few<double,_3>.array_[1];
  Write<double>::Write(&f.weighted_contrib,&weighted_contrib);
  Write<double>::Write(&f.masses.write_,&local_2b8);
  Write<double>::Write((Write<double> *)&l,(Write<double> *)&f);
  dVar5 = f.center.super_Few<double,_3>.array_[2];
  dVar3 = f.center.super_Few<double,_3>.array_[1];
  l.super_Few<double,_3>.array_[2] = f.center.super_Few<double,_3>.array_[0];
  Write<double>::Write(&local_270,&f.weighted_contrib);
  Write<double>::Write(&local_260,&f.masses.write_);
  if (0 < (int)uVar33) {
    entering_parallel = 1;
    Write<double>::Write((Write<signed_char> *)&c_9,(Write<signed_char> *)&l);
    c_9.super_Few<double,_3>.array_[2] = l.super_Few<double,_3>.array_[2];
    Write<double>::Write(&local_4a0,(Write<signed_char> *)&local_270);
    Write<double>::Write(&local_490,(Write<signed_char> *)&local_260);
    entering_parallel = 0;
    dVar30 = c_9.super_Few<double,_3>.array_[1];
    for (uVar39 = 0; uVar39 != (uVar33 & 0x7fffffff); uVar39 = uVar39 + 1) {
      for (lVar41 = 0; lVar41 != 3; lVar41 = lVar41 + 1) {
        x.super_Few<double,_3>.array_[lVar41] = *(double *)((long)dVar30 + lVar41 * 8);
      }
      v.super_Few<double,_6>.array_[2] = dVar5;
      v.super_Few<double,_6>.array_[1] = dVar3;
      v.super_Few<double,_6>.array_[0] = c_9.super_Few<double,_3>.array_[2];
      for (lVar41 = 0;
          uVar23 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2].
                   _4_4_,
          uVar22 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2].
                   _0_4_,
          uVar21 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1].
                   _0_4_,
          uVar20 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0].
                   _4_4_,
          uVar19 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0].
                   _0_4_, lVar41 != 3; lVar41 = lVar41 + 1) {
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[lVar41] =
             x.super_Few<double,_3>.array_[lVar41] - v.super_Few<double,_6>.array_[lVar41];
      }
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2] =
           (double)CONCAT44(ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                            array_[0]._4_4_,
                            ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                            array_[0]._0_4_);
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0] =
           (double)CONCAT44(ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                            array_[1]._4_4_,
                            ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                            array_[1]._0_4_);
      auVar17._8_4_ =
           ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._0_4_;
      auVar17._0_8_ = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0]
      ;
      auVar17._12_4_ =
           ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._4_4_;
      uVar50 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._4_4_
               ^ 0x80000000;
      dVar1 = *(double *)((long)local_490.shared_alloc_.direct_ptr + uVar39 * 8);
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._0_4_ = 0;
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._4_4_ = 0;
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._0_4_ =
           ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._0_4_;
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._4_4_ =
           ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._4_4_;
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._0_4_ = uVar21;
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._4_4_ = uVar50;
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] =
           -(double)CONCAT44(uVar23,uVar22);
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1] = 0.0;
      auVar7._8_4_ = uVar19;
      auVar7._0_8_ = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0];
      auVar7._12_4_ = uVar20 ^ 0x80000000;
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1] =
           (double)auVar7._8_8_;
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2] = 0.0;
      for (lVar41 = 0; lVar41 != 3; lVar41 = lVar41 + 1) {
        auVar18._8_8_ = 0;
        auVar18._0_8_ = auVar17._8_8_;
        v.super_Few<double,_6>.array_._0_16_ = auVar18 << 0x40;
        v.super_Few<double,_6>.array_[2] =
             -ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0];
        v.super_Few<double,_6>.array_[3] = -(double)CONCAT44(uVar23,uVar22);
        v.super_Few<double,_6>.array_[4] = 0.0;
        local_78[2] = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[lVar41].super_Few<double,_3>.
                      array_[2];
        v.super_Few<double,_6>.array_[5] =
             ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2];
        uStack_500 = uVar19;
        local_4f8 = 0;
        local_78[0] = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[lVar41].super_Few<double,_3>.
                      array_[0];
        local_78[1] = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[lVar41].super_Few<double,_3>.
                      array_[1];
        c_7.super_Few<double,_3>.array_[2] = v.super_Few<double,_6>.array_[2];
        c_7.super_Few<double,_3>.array_[0] = 0.0;
        c_7.super_Few<double,_3>.array_[1] = auVar17._8_8_;
        for (lVar42 = 0; lVar31 = 1, lVar42 != 3; lVar42 = lVar42 + 1) {
          c_2.super_Few<double,_3>.array_[lVar42] =
               c_7.super_Few<double,_3>.array_[lVar42] * local_78[0];
        }
        for (; lVar31 != 3; lVar31 = lVar31 + 1) {
          c_7.super_Few<double,_3>.array_[2] = v.super_Few<double,_6>.array_[lVar31 * 3 + 2];
          c_7.super_Few<double,_3>.array_[0] = v.super_Few<double,_6>.array_[lVar31 * 3];
          c_7.super_Few<double,_3>.array_[1] = v.super_Few<double,_6>.array_[lVar31 * 3 + 1];
          dVar2 = local_78[lVar31];
          for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
            c_4.super_Few<double,_3>.array_[lVar42] =
                 c_7.super_Few<double,_3>.array_[lVar42] * dVar2;
          }
          c_7.super_Few<double,_3>.array_[2] = c_4.super_Few<double,_3>.array_[2];
          c_7.super_Few<double,_3>.array_[0] = c_4.super_Few<double,_3>.array_[0];
          c_7.super_Few<double,_3>.array_[1] = c_4.super_Few<double,_3>.array_[1];
          local_228[0] = c_2.super_Few<double,_3>.array_[0];
          local_228[1] = c_2.super_Few<double,_3>.array_[1];
          local_228[2] = c_2.super_Few<double,_3>.array_[2];
          for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
            c_5.super_Few<double,_3>.array_[lVar42] =
                 local_228[lVar42] + c_7.super_Few<double,_3>.array_[lVar42];
          }
          c_2.super_Few<double,_3>.array_[0] = c_5.super_Few<double,_3>.array_[0];
          c_2.super_Few<double,_3>.array_[1] = c_5.super_Few<double,_3>.array_[1];
          c_2.super_Few<double,_3>.array_[2] = c_5.super_Few<double,_3>.array_[2];
        }
        c_1.super_Few<Omega_h::Vector<3>,_3>.array_[lVar41].super_Few<double,_3>.array_[2] =
             c_2.super_Few<double,_3>.array_[2];
        *(undefined4 *)
         c_1.super_Few<Omega_h::Vector<3>,_3>.array_[lVar41].super_Few<double,_3>.array_ =
             c_2.super_Few<double,_3>.array_[0]._0_4_;
        *(undefined4 *)
         ((long)c_1.super_Few<Omega_h::Vector<3>,_3>.array_[lVar41].super_Few<double,_3>.array_ + 4)
             = c_2.super_Few<double,_3>.array_[0]._4_4_;
        *(undefined4 *)
         (c_1.super_Few<Omega_h::Vector<3>,_3>.array_[lVar41].super_Few<double,_3>.array_ + 1) =
             c_2.super_Few<double,_3>.array_[1]._0_4_;
        *(undefined4 *)
         ((long)c_1.super_Few<Omega_h::Vector<3>,_3>.array_[lVar41].super_Few<double,_3>.array_ +
         0xc) = c_2.super_Few<double,_3>.array_[1]._4_4_;
        local_508 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0];
        uStack_4fc = uVar20 ^ 0x80000000;
      }
      for (lVar41 = 0; lVar41 != 3; lVar41 = lVar41 + 1) {
        dVar2 = c_1.super_Few<Omega_h::Vector<3>,_3>.array_[lVar41].super_Few<double,_3>.array_[2];
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._0_4_ =
             SUB84(dVar2,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._4_4_ =
             (uint)((ulong)dVar2 >> 0x20);
        dVar2 = c_1.super_Few<Omega_h::Vector<3>,_3>.array_[lVar41].super_Few<double,_3>.array_[0];
        dVar4 = c_1.super_Few<Omega_h::Vector<3>,_3>.array_[lVar41].super_Few<double,_3>.array_[1];
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._0_4_ =
             SUB84(dVar2,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._4_4_ =
             (uint)((ulong)dVar2 >> 0x20);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._0_4_ =
             SUB84(dVar4,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._4_4_ =
             (uint)((ulong)dVar4 >> 0x20);
        for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
          c_7.super_Few<double,_3>.array_[lVar42] =
               ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[lVar42] *
               -dVar1;
        }
        v.super_Few<double,_6>.array_[lVar41 * 3 + 2] = c_7.super_Few<double,_3>.array_[2];
        v.super_Few<double,_6>.array_[lVar41 * 3] = c_7.super_Few<double,_3>.array_[0];
        v.super_Few<double,_6>.array_[lVar41 * 3 + 1] = c_7.super_Few<double,_3>.array_[1];
      }
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._0_4_ =
           v.super_Few<double,_6>.array_[0]._0_4_;
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._4_4_ =
           v.super_Few<double,_6>.array_[0]._4_4_;
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._0_4_ =
           SUB84(v.super_Few<double,_6>.array_[4],0);
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._4_4_ =
           (uint)((ulong)v.super_Few<double,_6>.array_[4] >> 0x20);
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._0_4_ =
           (undefined4)local_4f8;
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._4_4_ =
           (uint)((ulong)local_4f8 >> 0x20);
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] =
           v.super_Few<double,_6>.array_[3];
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1] =
           (double)CONCAT44(uStack_4fc,uStack_500);
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2] = local_508;
      for (lVar41 = 0; lVar41 != 6; lVar41 = lVar41 + 1) {
        *(double *)((long)local_4a0.shared_alloc_.direct_ptr + lVar41 * 8) =
             ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[lVar41];
      }
      dVar30 = (double)((long)dVar30 + 0x18);
      local_4a0.shared_alloc_.direct_ptr = (void *)((long)local_4a0.shared_alloc_.direct_ptr + 0x30)
      ;
    }
    (anonymous_namespace)::
    get_matrix(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,Omega_h::Vector<3>)
    ::$_0::~__0((__0 *)&c_9);
  }
  (anonymous_namespace)::
  get_matrix(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,Omega_h::Vector<3>)
  ::$_0::~__0((__0 *)&l);
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)&ed,&local_b8);
  Write<double>::Write((Write<double> *)&c_9,&weighted_contrib);
  Read<double>::Read((Read<signed_char> *)&c_1,(Write<double> *)&c_9);
  pDVar25 = &ed;
  pdVar26 = (double *)&v;
  repro_sum((CommPtr *)pDVar25,(Reals *)&c_1,6,pdVar26);
  lVar41 = 1;
  Write<double>::~Write((Write<double> *)&c_1);
  Write<double>::~Write((Write<double> *)&c_9);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_ + 1));
  dVar4 = v.super_Few<double,_6>.array_[5];
  dVar2 = v.super_Few<double,_6>.array_[4];
  dVar1 = v.super_Few<double,_6>.array_[3];
  dVar5 = v.super_Few<double,_6>.array_[0];
  dVar30 = v.super_Few<double,_6>.array_[1];
  (anonymous_namespace)::
  get_matrix(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,Omega_h::Vector<3>)
  ::$_0::~__0((__0 *)&f);
  Write<double>::~Write(&weighted_contrib);
  Write<double>::~Write(&local_2b8);
  Write<double>::~Write(&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  v.super_Few<double,_6>.array_[1] = dVar1;
  v.super_Few<double,_6>.array_._0_16_ = CONCAT88(v.super_Few<double,_6>.array_[1],dVar5);
  v.super_Few<double,_6>.array_[2] = dVar4;
  v.super_Few<double,_6>.array_[3] = dVar1;
  v.super_Few<double,_6>.array_[4] = dVar30;
  v.super_Few<double,_6>.array_[5] = dVar2;
  dVar3 = 0.0;
  for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
    for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
      dVar62 = ABS(pdVar26[lVar31]);
      if (ABS(pdVar26[lVar31]) <= dVar3) {
        dVar62 = dVar3;
      }
      dVar3 = dVar62;
    }
    pdVar26 = pdVar26 + 3;
  }
  if (dVar3 <= 1e-10) {
    for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
      for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
        peVar47 = (element_type *)0x3ff0000000000000;
        if (lVar42 != lVar31) {
          peVar47 = (element_type *)0x0;
        }
        (pDVar25->q).super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[lVar31]
             = (double)peVar47;
      }
      pDVar25 = (DiagDecomp<3> *)((pDVar25->q).super_Few<Omega_h::Vector<3>,_3>.array_ + 1);
    }
    for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
      ed.l.super_Few<double,_3>.array_[lVar42] = 0.0;
    }
  }
  else {
    v.super_Few<double,_6>.array_._0_16_ = CONCAT88(v.super_Few<double,_6>.array_[1],dVar5);
    for (lVar42 = 0;
        dVar2 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2],
        auVar7 = (undefined1  [16])
                 ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_._0_16_,
        dVar1 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2],
        dVar30 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1],
        dVar5 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0],
        uVar23 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2].
                 _4_4_,
        uVar22 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2].
                 _0_4_,
        uVar20 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1].
                 _4_4_,
        uVar21 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1].
                 _0_4_,
        uVar33 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0].
                 _4_4_,
        uVar19 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0].
                 _0_4_, lVar42 != 3; lVar42 = lVar42 + 1) {
      c_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] =
           v.super_Few<double,_6>.array_[lVar42 * 3 + 2];
      c_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] =
           v.super_Few<double,_6>.array_[lVar42 * 3];
      c_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] =
           v.super_Few<double,_6>.array_[lVar42 * 3 + 1];
      for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
        c_9.super_Few<double,_3>.array_[lVar31] =
             c_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[lVar31] /
             dVar3;
      }
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[lVar42].super_Few<double,_3>.array_[2] =
           c_9.super_Few<double,_3>.array_[2];
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[lVar42].super_Few<double,_3>.array_[0] =
           c_9.super_Few<double,_3>.array_[0];
      ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[lVar42].super_Few<double,_3>.array_[1] =
           c_9.super_Few<double,_3>.array_[1];
    }
    dVar4 = (double)CONCAT44(ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                             array_[0]._4_4_,
                             ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                             array_[0]._0_4_);
    auVar16._8_4_ =
         ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._0_4_;
    auVar16._0_8_ = dVar4;
    auVar16._12_4_ =
         ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._4_4_;
    dVar53 = auVar16._8_8_;
    dVar62 = (double)CONCAT44(ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                              array_[2]._4_4_,
                              ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                              array_[2]._0_4_);
    dVar13 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0];
    dVar15 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1];
    for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
      local_228[2] = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[lVar42].super_Few<double,_3>.
                     array_[2];
      local_228[0] = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[lVar42].super_Few<double,_3>.
                     array_[0];
      local_228[1] = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[lVar42].super_Few<double,_3>.
                     array_[1];
      v.super_Few<double,_6>.array_[0] = dVar4;
      v.super_Few<double,_6>.array_[1] = (double)auVar16._8_8_;
      v.super_Few<double,_6>.array_[2] = dVar62;
      v.super_Few<double,_6>.array_[3] = dVar5;
      v.super_Few<double,_6>.array_[4] = dVar30;
      v.super_Few<double,_6>.array_[5] = dVar1;
      c_9.super_Few<double,_3>.array_[2] = dVar62;
      c_9.super_Few<double,_3>.array_[1] = dVar53;
      c_9.super_Few<double,_3>.array_[0] = dVar4;
      for (lVar31 = 0; lVar28 = 1, lVar31 != 3; lVar31 = lVar31 + 1) {
        c_5.super_Few<double,_3>.array_[lVar31] =
             c_9.super_Few<double,_3>.array_[lVar31] * local_228[0];
      }
      for (; lVar28 != 3; lVar28 = lVar28 + 1) {
        c_9.super_Few<double,_3>.array_[2] = v.super_Few<double,_6>.array_[lVar28 * 3 + 2];
        c_9.super_Few<double,_3>.array_[0] = v.super_Few<double,_6>.array_[lVar28 * 3];
        c_9.super_Few<double,_3>.array_[1] = v.super_Few<double,_6>.array_[lVar28 * 3 + 1];
        dVar54 = local_228[lVar28];
        for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
          c_7.super_Few<double,_3>.array_[lVar31] = c_9.super_Few<double,_3>.array_[lVar31] * dVar54
          ;
        }
        c_9.super_Few<double,_3>.array_[2] = c_7.super_Few<double,_3>.array_[2];
        c_9.super_Few<double,_3>.array_[1] = c_7.super_Few<double,_3>.array_[1];
        c_9.super_Few<double,_3>.array_[0] = c_7.super_Few<double,_3>.array_[0];
        l.super_Few<double,_3>.array_[0] = c_5.super_Few<double,_3>.array_[0];
        l.super_Few<double,_3>.array_[1] = c_5.super_Few<double,_3>.array_[1];
        l.super_Few<double,_3>.array_[2] = c_5.super_Few<double,_3>.array_[2];
        for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
          f.center.super_Few<double,_3>.array_[lVar31 + -2] =
               l.super_Few<double,_3>.array_[lVar31] + c_9.super_Few<double,_3>.array_[lVar31];
        }
        c_5.super_Few<double,_3>.array_[0] = (double)f.coords.write_.shared_alloc_.alloc;
        c_5.super_Few<double,_3>.array_[1] = (double)f.coords.write_.shared_alloc_.direct_ptr;
        c_5.super_Few<double,_3>.array_[2] = f.center.super_Few<double,_3>.array_[0];
      }
      c_1.super_Few<Omega_h::Vector<3>,_3>.array_[lVar42].super_Few<double,_3>.array_[2] =
           c_5.super_Few<double,_3>.array_[2];
      c_1.super_Few<Omega_h::Vector<3>,_3>.array_[lVar42].super_Few<double,_3>.array_[0] =
           c_5.super_Few<double,_3>.array_[0];
      c_1.super_Few<Omega_h::Vector<3>,_3>.array_[lVar42].super_Few<double,_3>.array_[1] =
           c_5.super_Few<double,_3>.array_[1];
    }
    dVar64 = dVar4 + ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1]
             + dVar2;
    dVar65 = dVar64 * dVar64;
    dVar48 = (dVar65 - (c_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                        [0] + c_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.
                              array_[1] +
                       c_1.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2]
                       )) * 0.5;
    dVar54 = ((dVar48 * 3.0 - dVar65) / 3.0) / 3.0;
    dVar48 = ((dVar65 * dVar64 + dVar65 * dVar64 +
              dVar48 * -9.0 * dVar64 +
              ((((dVar53 * dVar13 * dVar1 + dVar4 * dVar30 * dVar2 + dVar5 * dVar15 * dVar62) -
                dVar30 * dVar13 * dVar62) - dVar53 * dVar5 * dVar2) - dVar15 * dVar4 * dVar1) * 27.0
              ) / 27.0) * 0.5;
    dVar53 = dVar54 * dVar54 * dVar54;
    dVar62 = dVar48 * dVar48 + dVar53;
    dVar64 = dVar64 / 3.0;
    if (0.0 <= dVar62) {
      dVar53 = SQRT(dVar62);
      dVar54 = dVar53;
      if (0.0 > dVar62) {
        dVar54 = sqrt(dVar62);
      }
      dVar54 = cbrt(dVar54 + dVar48);
      if (dVar62 < 0.0) {
        dVar53 = sqrt(dVar62);
      }
      dVar62 = cbrt(dVar48 - dVar53);
      dVar54 = dVar54 + dVar62;
      pAVar49 = (Alloc *)(dVar54 * -0.5 + dVar64);
      l.super_Few<double,_3>.array_[2] = (double)pAVar49;
    }
    else {
      if (-0.0 < dVar53) {
        dVar62 = sqrt(-dVar53);
      }
      else {
        dVar62 = SQRT(-dVar53);
      }
      dVar53 = -1.0;
      if (-1.0 <= dVar48 / dVar62) {
        dVar53 = dVar48 / dVar62;
      }
      uVar45 = 0;
      uVar46 = 0x3ff00000;
      if (dVar53 <= 1.0) {
        uVar45 = SUB84(dVar53,0);
        uVar46 = (undefined4)((ulong)dVar53 >> 0x20);
      }
      dVar62 = acos((double)CONCAT44(uVar46,uVar45));
      if (-0.0 < dVar54) {
        dVar53 = sqrt(-dVar54);
      }
      else {
        dVar53 = SQRT(-dVar54);
      }
      dVar53 = dVar53 + dVar53;
      dVar54 = cos(dVar62 / 3.0);
      dVar54 = dVar54 * dVar53;
      dVar48 = cos((dVar62 + 6.283185307179586) / 3.0);
      pAVar49 = (Alloc *)(dVar48 * dVar53 + dVar64);
      dVar62 = cos((dVar62 + -6.283185307179586) / 3.0);
      l.super_Few<double,_3>.array_[2] = (double)(dVar62 * dVar53 + dVar64);
    }
    l.super_Few<double,_3>.array_[0] = dVar54 + dVar64;
    local_328 = auVar7._0_4_;
    uStack_324 = auVar7._4_4_;
    pAVar55 = pAVar49;
    pAVar59 = (Alloc *)l.super_Few<double,_3>.array_[0];
    pAVar14 = (Alloc *)l.super_Few<double,_3>.array_[2];
    if (((ABS(l.super_Few<double,_3>.array_[0] - (double)pAVar49) < 5e-05) ||
        (pAVar55 = (Alloc *)l.super_Few<double,_3>.array_[0],
        pAVar59 = (Alloc *)l.super_Few<double,_3>.array_[2], pAVar14 = pAVar49,
        ABS(l.super_Few<double,_3>.array_[0] - l.super_Few<double,_3>.array_[2]) < 5e-05)) ||
       (pAVar55 = pAVar49, pAVar14 = (Alloc *)l.super_Few<double,_3>.array_[0],
       ABS((double)pAVar49 - l.super_Few<double,_3>.array_[2]) < 5e-05)) {
      pvVar56 = (void *)(((double)pAVar55 + (double)pAVar59) * 0.5);
      if (5e-05 <= ABS((double)pAVar14 - (double)pvVar56)) {
        l.super_Few<double,_3>.array_[0] = (double)pAVar14;
        l.super_Few<double,_3>.array_[1] = (double)pvVar56;
        l.super_Few<double,_3>.array_[2] = (double)pAVar59;
        pdVar26 = (double *)&v;
        v.super_Few<double,_6>.array_[1]._0_4_ = uVar21;
        v.super_Few<double,_6>.array_[0] = dVar4;
        v.super_Few<double,_6>.array_[1]._4_4_ = uVar20;
        v.super_Few<double,_6>.array_[2] = (double)CONCAT44(uVar23,uVar22);
        v.super_Few<double,_6>.array_[3] = dVar5;
        v.super_Few<double,_6>.array_[4] = dVar30;
        v.super_Few<double,_6>.array_[5] = dVar1;
        for (lVar42 = 0; lVar42 != 0x48; lVar42 = lVar42 + 0x18) {
          *pdVar26 = *pdVar26 - (double)pAVar14;
          pdVar26 = pdVar26 + 4;
        }
        pDVar25 = &ed;
        pdVar26 = (double *)&v;
        pdVar37 = pdVar26;
        pDVar36 = pDVar25;
        for (lVar42 = 9; lVar42 != 0; lVar42 = lVar42 + -1) {
          (pDVar36->q).super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] =
               (((Vector<6> *)pdVar37)->super_Few<double,_6>).array_[0];
          pdVar37 = (double *)((long)pdVar37 + ((ulong)bVar44 * -2 + 1) * 8);
          pDVar36 = (DiagDecomp<3> *)((long)pDVar36 + (ulong)bVar44 * -0x10 + 8);
        }
        for (lVar42 = 0; dVar54 = v.super_Few<double,_6>.array_[5],
            dVar53 = v.super_Few<double,_6>.array_[4], dVar62 = v.super_Few<double,_6>.array_[3],
            dVar4 = v.super_Few<double,_6>.array_[2], lVar42 != 3; lVar42 = lVar42 + 1) {
          pDVar36 = pDVar25;
          for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
            pdVar26[lVar31] =
                 (pDVar36->q).super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                 [0];
            pDVar36 = (DiagDecomp<3> *)((pDVar36->q).super_Few<Omega_h::Vector<3>,_3>.array_ + 1);
          }
          pdVar26 = pdVar26 + 3;
          pDVar25 = (DiagDecomp<3> *)
                    ((pDVar25->q).super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                     array_ + 1);
        }
        dVar61 = v.super_Few<double,_6>.array_[0];
        dVar52 = v.super_Few<double,_6>.array_[1];
        dVar65 = -v.super_Few<double,_6>.array_[2];
        dVar58 = v.super_Few<double,_6>.array_[1] * v.super_Few<double,_6>.array_[5] -
                 v.super_Few<double,_6>.array_[4] * v.super_Few<double,_6>.array_[2];
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] =
             v.super_Few<double,_6>.array_[2] * v.super_Few<double,_6>.array_[3] -
             v.super_Few<double,_6>.array_[5] * v.super_Few<double,_6>.array_[0];
        uVar45 = (undefined4)
                 ((ulong)ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                         [1] >> 0x20);
        dVar64 = -v.super_Few<double,_6>.array_[1];
        dVar51 = v.super_Few<double,_6>.array_[0] * v.super_Few<double,_6>.array_[4] -
                 v.super_Few<double,_6>.array_[3] * v.super_Few<double,_6>.array_[1];
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._0_4_ =
             SUB84(dVar58,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._4_4_ =
             (uint)((ulong)dVar58 >> 0x20);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._0_4_ =
             SUB84(dVar51,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._4_4_ =
             (uint)((ulong)dVar51 >> 0x20);
        auVar11._8_4_ =
             SUB84(ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1],0)
        ;
        auVar11._0_8_ = dVar58;
        auVar11._12_4_ = uVar45;
        c_9.super_Few<double,_3>.array_[0] = dVar58;
        c_9.super_Few<double,_3>.array_[1] = (double)auVar11._8_8_;
        c_9.super_Few<double,_3>.array_[2] = dVar51;
        dVar48 = dVar58 * dVar58;
        for (lVar42 = 1; lVar42 != 3; lVar42 = lVar42 + 1) {
          dVar48 = dVar48 + c_9.super_Few<double,_3>.array_[lVar42] *
                            ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                            array_[lVar42];
        }
        auVar8._8_4_ = v.super_Few<double,_6>.array_[0]._0_4_;
        auVar8._0_8_ = dVar65;
        auVar8._12_4_ = v.super_Few<double,_6>.array_[0]._4_4_ ^ 0x80000000;
        auVar12._8_4_ =
             SUB84(ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1],0)
        ;
        auVar12._0_8_ = dVar58;
        auVar12._12_4_ = uVar45;
        if (dVar48 < 0.0) {
          ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] = dVar51;
          ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] = dVar58;
          dVar48 = sqrt(dVar48);
        }
        else {
          dVar48 = SQRT(dVar48);
        }
        dVar57 = dVar53 * dVar2 - dVar54 * dVar15;
        dStack_330 = dVar54 * dVar13 - dVar62 * dVar2;
        dVar53 = dVar62 * dVar15 - dVar53 * dVar13;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._0_4_ =
             SUB84(dVar57,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._4_4_ =
             (uint)((ulong)dVar57 >> 0x20);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._0_4_ =
             SUB84(dStack_330,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._4_4_ =
             (uint)((ulong)dStack_330 >> 0x20);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._0_4_ =
             SUB84(dVar53,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._4_4_ =
             (uint)((ulong)dVar53 >> 0x20);
        c_9.super_Few<double,_3>.array_[0] = dVar57;
        c_9.super_Few<double,_3>.array_[1] = dStack_330;
        c_9.super_Few<double,_3>.array_[2] = dVar53;
        dVar62 = dVar57 * dVar57;
        for (lVar42 = 1; lVar42 != 3; lVar42 = lVar42 + 1) {
          dVar62 = dVar62 + c_9.super_Few<double,_3>.array_[lVar42] *
                            ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                            array_[lVar42];
        }
        if (dVar62 < 0.0) {
          auVar9._8_4_ = local_328;
          auVar9._0_8_ = dVar2;
          auVar9._12_4_ = uStack_324;
          ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] = dVar57;
          ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] =
               dStack_330;
          ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] = dVar53;
          dVar62 = sqrt(dVar62);
          dVar54 = auVar9._8_8_;
        }
        else {
          dVar62 = SQRT(dVar62);
          dVar54 = dVar13;
        }
        dStack_4d0 = auVar8._8_8_;
        dVar60 = dVar62;
        if (dVar62 <= dVar48) {
          dStack_330 = auVar12._8_8_;
          dVar60 = dVar48;
          dVar57 = dVar58;
        }
        dVar65 = dVar52 * dVar2 + dVar15 * dVar65;
        dVar54 = dVar4 * dVar54 + dVar2 * dStack_4d0;
        dVar13 = dVar61 * dVar15 + dVar13 * dVar64;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._0_4_ =
             SUB84(dVar65,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._4_4_ =
             (uint)((ulong)dVar65 >> 0x20);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._0_4_ =
             SUB84(dVar54,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._4_4_ =
             (uint)((ulong)dVar54 >> 0x20);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._0_4_ =
             SUB84(dVar13,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._4_4_ =
             (uint)((ulong)dVar13 >> 0x20);
        c_9.super_Few<double,_3>.array_[1] = dVar54;
        c_9.super_Few<double,_3>.array_[0] = dVar65;
        c_9.super_Few<double,_3>.array_[2] = dVar13;
        dVar4 = dVar65 * dVar65;
        for (lVar42 = 1; lVar42 != 3; lVar42 = lVar42 + 1) {
          dVar4 = dVar4 + c_9.super_Few<double,_3>.array_[lVar42] *
                          ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                          array_[lVar42];
        }
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] = dVar13;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] = dVar65;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] = dVar54;
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        dVar15 = dVar4;
        if (dVar4 <= dVar60) {
          dVar65 = dVar57;
          dVar54 = dStack_330;
          dVar15 = dVar60;
        }
        if (dVar15 <= 1e-10) {
          uVar32 = 0xbf;
          local_358 = "v_norm > EPSILON";
LAB_002a7187:
          fail("assertion %s failed at %s +%d\n",local_358,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
               ,uVar32);
        }
        uVar39 = ~-(ulong)(dVar60 < dVar4) &
                 (~-(ulong)(dVar48 < dVar62) & (ulong)dVar51 |
                 (ulong)dVar53 & -(ulong)(dVar48 < dVar62)) |
                 (ulong)dVar13 & -(ulong)(dVar60 < dVar4);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._0_4_ =
             SUB84(dVar65,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._4_4_ =
             (uint)((ulong)dVar65 >> 0x20);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._0_4_ =
             SUB84(dVar54,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._4_4_ =
             (uint)((ulong)dVar54 >> 0x20);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._0_4_ =
             (undefined4)uVar39;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._4_4_ =
             (uint)(uVar39 >> 0x20);
        for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
          c_9.super_Few<double,_3>.array_[lVar42] =
               ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[lVar42] /
               dVar15;
        }
        c_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] =
             c_9.super_Few<double,_3>.array_[0];
        c_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] =
             c_9.super_Few<double,_3>.array_[1];
        c_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] =
             c_9.super_Few<double,_3>.array_[2];
        f.coords.write_.shared_alloc_.alloc = pAVar14;
        pDVar25 = &ed;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._0_4_ =
             uVar19;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._4_4_ =
             uVar33;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._0_4_ =
             uVar21;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._4_4_ =
             uVar20;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._0_4_ =
             uVar22;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._4_4_ =
             uVar23;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] = dVar5;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1] = dVar30;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2] = dVar1;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_._0_16_ = auVar7;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2] = dVar2;
        for (lVar42 = 0; lVar42 != 0x48; lVar42 = lVar42 + 0x18) {
          (pDVar25->q).super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] =
               (pDVar25->q).super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
               [0] - (double)pvVar56;
          pDVar25 = (DiagDecomp<3> *)
                    ((pDVar25->q).super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.
                     array_ + 1);
        }
        pdVar26 = (double *)&v;
        pDVar25 = &ed;
        pDVar36 = pDVar25;
        pdVar37 = pdVar26;
        for (lVar42 = 9; lVar42 != 0; lVar42 = lVar42 + -1) {
          (((Vector<6> *)pdVar37)->super_Few<double,_6>).array_[0] =
               (pDVar36->q).super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
               [0];
          pDVar36 = (DiagDecomp<3> *)((long)pDVar36 + (ulong)bVar44 * -0x10 + 8);
          pdVar37 = (double *)((long)pdVar37 + ((ulong)bVar44 * -2 + 1) * 8);
        }
        for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
          pdVar37 = pdVar26;
          for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
            (pDVar25->q).super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
            [lVar31] = *pdVar37;
            pdVar37 = pdVar37 + 3;
          }
          pDVar25 = (DiagDecomp<3> *)((pDVar25->q).super_Few<Omega_h::Vector<3>,_3>.array_ + 1);
          pdVar26 = pdVar26 + 1;
        }
        v.super_Few<double,_6>.array_[2] =
             (double)CONCAT44(ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                              array_[2]._4_4_,
                              ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                              array_[2]._0_4_);
        v.super_Few<double,_6>.array_[0] =
             (double)CONCAT44(ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                              array_[0]._4_4_,
                              ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                              array_[0]._0_4_);
        v.super_Few<double,_6>.array_[1] =
             (double)CONCAT44(ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                              array_[1]._4_4_,
                              ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                              array_[1]._0_4_);
        c_9.super_Few<double,_3>.array_[1] =
             (double)CONCAT44(ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                              array_[1]._4_4_,
                              ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                              array_[1]._0_4_);
        c_9.super_Few<double,_3>.array_[0] = v.super_Few<double,_6>.array_[0];
        c_9.super_Few<double,_3>.array_[2] =
             (double)CONCAT44(ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                              array_[2]._4_4_,
                              ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                              array_[2]._0_4_);
        dVar5 = v.super_Few<double,_6>.array_[0] * v.super_Few<double,_6>.array_[0];
        for (lVar42 = 1; lVar42 != 3; lVar42 = lVar42 + 1) {
          dVar5 = dVar5 + c_9.super_Few<double,_3>.array_[lVar42] *
                          v.super_Few<double,_6>.array_[lVar42];
        }
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        uVar39 = 0;
        uVar43 = 1;
        while( true ) {
          if (uVar43 == 3) break;
          v.super_Few<double,_6>.array_[2] =
               ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[uVar43].super_Few<double,_3>.array_[2];
          v.super_Few<double,_6>.array_[0] =
               ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[uVar43].super_Few<double,_3>.array_[0];
          v.super_Few<double,_6>.array_[1] =
               ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[uVar43].super_Few<double,_3>.array_[1];
          c_9.super_Few<double,_3>.array_[0] =
               ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[uVar43].super_Few<double,_3>.array_[0];
          c_9.super_Few<double,_3>.array_[1] =
               ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[uVar43].super_Few<double,_3>.array_[1];
          c_9.super_Few<double,_3>.array_[2] =
               ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[uVar43].super_Few<double,_3>.array_[2];
          dVar30 = c_9.super_Few<double,_3>.array_[0] * v.super_Few<double,_6>.array_[0];
          for (uVar27 = 1; uVar27 != 3; uVar27 = uVar27 + 1) {
            dVar30 = dVar30 + c_9.super_Few<double,_3>.array_[uVar27] *
                              v.super_Few<double,_6>.array_[uVar27];
          }
          if (dVar30 < 0.0) {
            dVar30 = sqrt(dVar30);
          }
          else {
            dVar30 = SQRT(dVar30);
          }
          if (dVar5 < dVar30) {
            uVar39 = uVar43 & 0xffffffff;
            dVar5 = dVar30;
          }
          uVar43 = uVar43 + 1;
        }
        if (dVar5 <= 1e-10) {
          uVar32 = 0xd3;
          local_358 = "best_norm > EPSILON";
          goto LAB_002a7187;
        }
        iVar34 = (int)uVar39;
        v.super_Few<double,_6>.array_[2] =
             ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[iVar34].super_Few<double,_3>.array_[2];
        v.super_Few<double,_6>.array_[1] =
             ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[iVar34].super_Few<double,_3>.array_[1];
        v.super_Few<double,_6>.array_[0] =
             ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[iVar34].super_Few<double,_3>.array_[0];
        for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
          c_9.super_Few<double,_3>.array_[lVar42] = v.super_Few<double,_6>.array_[lVar42] / dVar5;
        }
        dVar30 = (double)((ulong)c_9.super_Few<double,_3>.array_[2] & 0x8000000000000000 |
                         (ulong)DAT_0037e300);
        dVar5 = -1.0 / (c_9.super_Few<double,_3>.array_[2] + dVar30);
        c_1.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0] =
             c_9.super_Few<double,_3>.array_[0] * c_9.super_Few<double,_3>.array_[1] * dVar5;
        c_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] =
             c_9.super_Few<double,_3>.array_[0] * dVar30 * c_9.super_Few<double,_3>.array_[0] *
             dVar5 + 1.0;
        c_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1] =
             c_1.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0] * dVar30;
        auVar6._8_4_ = SUB84(-dVar30 * c_9.super_Few<double,_3>.array_[0],0);
        auVar6._0_8_ = c_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1]
        ;
        auVar6._12_4_ = (int)((ulong)(-dVar30 * c_9.super_Few<double,_3>.array_[0]) >> 0x20);
        c_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2] =
             (double)auVar6._8_8_;
        c_1.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1] =
             c_9.super_Few<double,_3>.array_[1] * c_9.super_Few<double,_3>.array_[1] * dVar5 +
             dVar30;
        c_1.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2] =
             -c_9.super_Few<double,_3>.array_[1];
        f.center.super_Few<double,_3>.array_[0] = (double)pvVar56;
        f.coords.write_.shared_alloc_.direct_ptr = pvVar56;
      }
      else {
        f.center.super_Few<double,_3>.array_[0] =
             (double)pAVar14 * 0.3333333333333333 + (double)pvVar56 * 0.6666666666666666;
        f.coords.write_.shared_alloc_.direct_ptr = (void *)f.center.super_Few<double,_3>.array_[0];
        f.coords.write_.shared_alloc_.alloc = (Alloc *)f.center.super_Few<double,_3>.array_[0];
        pdVar26 = (double *)&v;
        for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
          for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
            uVar32 = 0x3ff0000000000000;
            if (lVar42 != lVar31) {
              uVar32 = 0;
            }
            pdVar26[lVar31] = (double)uVar32;
          }
          pdVar26 = pdVar26 + 3;
        }
        pVVar35 = &v;
        pMVar38 = &c_1;
        for (lVar42 = 9; lVar42 != 0; lVar42 = lVar42 + -1) {
          (pMVar38->super_Few<Omega_h::Vector<3>,_3>).array_[0].super_Few<double,_3>.array_[0] =
               (pVVar35->super_Few<double,_6>).array_[0];
          pVVar35 = (Vector<6> *)((long)pVVar35 + ((ulong)bVar44 * -2 + 1) * 8);
          pMVar38 = (Matrix<3,_3> *)((long)pMVar38 + ((ulong)bVar44 * -2 + 1) * 8);
        }
      }
    }
    else {
      l.super_Few<double,_3>.array_[1] = (double)pAVar49;
      lVar42 = 1;
      local_358 = "v_norm > EPSILON";
      for (lVar31 = 0; lVar31 != 3; lVar31 = lVar31 + 1) {
        dVar4 = l.super_Few<double,_3>.array_[lVar31];
        v.super_Few<double,_6>.array_[0]._4_4_ = uVar33;
        v.super_Few<double,_6>.array_[0]._0_4_ = uVar19;
        v.super_Few<double,_6>.array_[1]._0_4_ = uVar21;
        v.super_Few<double,_6>.array_[1]._4_4_ = uVar20;
        v.super_Few<double,_6>.array_[2] = (double)CONCAT44(uVar23,uVar22);
        v.super_Few<double,_6>.array_[3] = dVar5;
        v.super_Few<double,_6>.array_[4] = dVar30;
        v.super_Few<double,_6>.array_[5] = dVar1;
        pdVar26 = (double *)&v;
        for (lVar28 = 0; lVar40 = 9, pdVar37 = (double *)&v, pDVar25 = &ed, lVar28 != 0x48;
            lVar28 = lVar28 + 0x18) {
          *pdVar26 = *pdVar26 - dVar4;
          pdVar26 = pdVar26 + 4;
        }
        for (; lVar40 != 0; lVar40 = lVar40 + -1) {
          (pDVar25->q).super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] =
               *pdVar37;
          pdVar37 = pdVar37 + (ulong)bVar44 * -2 + 1;
          pDVar25 = (DiagDecomp<3> *)((long)pDVar25 + (ulong)bVar44 * -0x10 + 8);
        }
        pDVar25 = &ed;
        pdVar26 = (double *)&v;
        for (lVar28 = 0; dVar48 = v.super_Few<double,_6>.array_[5],
            dVar54 = v.super_Few<double,_6>.array_[4], dVar53 = v.super_Few<double,_6>.array_[3],
            dVar62 = v.super_Few<double,_6>.array_[2], lVar28 != 3; lVar28 = lVar28 + 1) {
          pDVar36 = pDVar25;
          for (lVar40 = 0; lVar40 != 3; lVar40 = lVar40 + 1) {
            pdVar26[lVar40] =
                 (pDVar36->q).super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                 [0];
            pDVar36 = (DiagDecomp<3> *)((pDVar36->q).super_Few<Omega_h::Vector<3>,_3>.array_ + 1);
          }
          pdVar26 = pdVar26 + 3;
          pDVar25 = (DiagDecomp<3> *)
                    ((pDVar25->q).super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                     array_ + 1);
        }
        dVar58 = v.super_Few<double,_6>.array_[0];
        dVar61 = v.super_Few<double,_6>.array_[1];
        dVar65 = -v.super_Few<double,_6>.array_[2];
        dVar51 = v.super_Few<double,_6>.array_[1] * v.super_Few<double,_6>.array_[5] -
                 v.super_Few<double,_6>.array_[4] * v.super_Few<double,_6>.array_[2];
        dVar57 = v.super_Few<double,_6>.array_[2] * v.super_Few<double,_6>.array_[3] -
                 v.super_Few<double,_6>.array_[5] * v.super_Few<double,_6>.array_[0];
        dVar52 = -v.super_Few<double,_6>.array_[1];
        dVar60 = v.super_Few<double,_6>.array_[0] * v.super_Few<double,_6>.array_[4] -
                 v.super_Few<double,_6>.array_[3] * v.super_Few<double,_6>.array_[1];
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._0_4_ =
             SUB84(dVar57,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._4_4_ =
             (uint)((ulong)dVar57 >> 0x20);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._0_4_ =
             SUB84(dVar60,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._4_4_ =
             (uint)((ulong)dVar60 >> 0x20);
        c_9.super_Few<double,_3>.array_[1] = dVar57;
        c_9.super_Few<double,_3>.array_[2] = dVar60;
        dVar64 = dVar51 * dVar51;
        for (lVar28 = lVar42; lVar28 != 3; lVar28 = lVar28 + 1) {
          dVar64 = dVar64 + c_9.super_Few<double,_3>.array_[lVar28] *
                            ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                            array_[lVar28];
        }
        auVar10._8_4_ = v.super_Few<double,_6>.array_[0]._0_4_;
        auVar10._0_8_ = dVar65;
        auVar10._12_4_ = v.super_Few<double,_6>.array_[0]._4_4_ ^ 0x80000000;
        if (dVar64 < 0.0) {
          ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] = dVar57;
          ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] = dVar60;
          dVar64 = sqrt(dVar64);
        }
        else {
          dVar64 = SQRT(dVar64);
        }
        dVar63 = dVar54 * dVar2 - dVar48 * dVar15;
        dVar48 = dVar48 * dVar13 - dVar53 * dVar2;
        dVar54 = dVar53 * dVar15 - dVar54 * dVar13;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._0_4_ =
             SUB84(dVar48,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._4_4_ =
             (uint)((ulong)dVar48 >> 0x20);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._0_4_ =
             SUB84(dVar54,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._4_4_ =
             (uint)((ulong)dVar54 >> 0x20);
        c_9.super_Few<double,_3>.array_[1] = dVar48;
        c_9.super_Few<double,_3>.array_[2] = dVar54;
        dVar53 = dVar63 * dVar63;
        for (lVar28 = lVar42; lVar28 != 3; lVar28 = lVar28 + 1) {
          dVar53 = dVar53 + c_9.super_Few<double,_3>.array_[lVar28] *
                            ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                            array_[lVar28];
        }
        if (dVar53 < 0.0) {
          ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] = dVar48;
          ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] = dVar54;
          dVar53 = sqrt(dVar53);
        }
        else {
          dVar53 = SQRT(dVar53);
        }
        dStack_570 = auVar10._8_8_;
        if (dVar53 <= dVar64) {
          dVar63 = dVar51;
          dVar48 = dVar57;
        }
        dVar51 = dVar53;
        if (dVar53 <= dVar64) {
          dVar51 = dVar64;
        }
        dVar61 = dVar61 * dVar2 + dVar15 * dVar65;
        dVar65 = dVar62 * dVar13 + dVar2 * dStack_570;
        dVar58 = dVar58 * dVar15 + dVar13 * dVar52;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._0_4_ =
             SUB84(dVar65,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._4_4_ =
             (uint)((ulong)dVar65 >> 0x20);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._0_4_ =
             SUB84(dVar58,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._4_4_ =
             (uint)((ulong)dVar58 >> 0x20);
        c_9.super_Few<double,_3>.array_[1] = dVar65;
        c_9.super_Few<double,_3>.array_[2] = dVar58;
        dVar62 = dVar61 * dVar61;
        for (lVar28 = lVar42; lVar28 != 3; lVar28 = lVar28 + 1) {
          dVar62 = dVar62 + c_9.super_Few<double,_3>.array_[lVar28] *
                            ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.
                            array_[lVar28];
        }
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] = dVar58;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] = dVar65;
        if (dVar62 < 0.0) {
          dVar62 = sqrt(dVar62);
        }
        else {
          dVar62 = SQRT(dVar62);
        }
        dVar52 = dVar62;
        if (dVar62 <= dVar51) {
          dVar52 = dVar51;
          dVar65 = dVar48;
          dVar61 = dVar63;
        }
        if (dVar52 <= 1e-10) {
          uVar32 = 0xbf;
          goto LAB_002a7187;
        }
        uVar39 = ~-(ulong)(dVar51 < dVar62) &
                 (~-(ulong)(dVar64 < dVar53) & (ulong)dVar60 |
                 (ulong)dVar54 & -(ulong)(dVar64 < dVar53)) |
                 (ulong)dVar58 & -(ulong)(dVar51 < dVar62);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._0_4_ =
             SUB84(dVar61,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0]._4_4_ =
             (uint)((ulong)dVar61 >> 0x20);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._0_4_ =
             SUB84(dVar65,0);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1]._4_4_ =
             (uint)((ulong)dVar65 >> 0x20);
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._0_4_ =
             (undefined4)uVar39;
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]._4_4_ =
             (uint)(uVar39 >> 0x20);
        for (lVar28 = 0; lVar28 != 3; lVar28 = lVar28 + 1) {
          c_9.super_Few<double,_3>.array_[lVar28] =
               ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[lVar28] /
               dVar52;
        }
        c_1.super_Few<Omega_h::Vector<3>,_3>.array_[lVar31].super_Few<double,_3>.array_[0] =
             c_9.super_Few<double,_3>.array_[0];
        c_1.super_Few<Omega_h::Vector<3>,_3>.array_[lVar31].super_Few<double,_3>.array_[1] =
             c_9.super_Few<double,_3>.array_[1];
        c_1.super_Few<Omega_h::Vector<3>,_3>.array_[lVar31].super_Few<double,_3>.array_[2] =
             c_9.super_Few<double,_3>.array_[2];
        f.center.super_Few<double,_3>.array_[lVar31 + -2] = dVar4;
      }
    }
    lVar42 = 9;
    pMVar38 = &c_1;
    pVVar35 = &v;
    for (lVar31 = lVar42; dVar5 = f.center.super_Few<double,_3>.array_[0],
        pvVar56 = f.coords.write_.shared_alloc_.direct_ptr,
        pAVar49 = f.coords.write_.shared_alloc_.alloc, lVar31 != 0; lVar31 = lVar31 + -1) {
      (pVVar35->super_Few<double,_6>).array_[0] =
           (pMVar38->super_Few<Omega_h::Vector<3>,_3>).array_[0].super_Few<double,_3>.array_[0];
      pMVar38 = (Matrix<3,_3> *)((long)pMVar38 + ((ulong)bVar44 * -2 + 1) * 8);
      pVVar35 = (Vector<6> *)((long)pVVar35 + ((ulong)bVar44 * -2 + 1) * 8);
    }
    pVVar35 = &v;
    pDVar25 = &ed;
    for (; lVar42 != 0; lVar42 = lVar42 + -1) {
      (pDVar25->q).super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] =
           (pVVar35->super_Few<double,_6>).array_[0];
      pVVar35 = (Vector<6> *)((long)pVVar35 + ((ulong)bVar44 * -2 + 1) * 8);
      pDVar25 = (DiagDecomp<3> *)((long)pDVar25 + (ulong)bVar44 * -0x10 + 8);
    }
    c_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] = dVar5;
    c_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] = (double)pAVar49;
    c_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] = (double)pvVar56;
    for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
      ed.l.super_Few<double,_3>.array_[lVar42] =
           c_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[lVar42] *
           dVar3;
    }
  }
  l.super_Few<double,_3>.array_[2] = ed.l.super_Few<double,_3>.array_[2];
  l.super_Few<double,_3>.array_[0] = ed.l.super_Few<double,_3>.array_[0];
  l.super_Few<double,_3>.array_[1] = ed.l.super_Few<double,_3>.array_[1];
  pDVar25 = &ed;
  pVVar35 = &v;
  for (lVar42 = 9; lVar42 != 0; lVar42 = lVar42 + -1) {
    (pVVar35->super_Few<double,_6>).array_[0] =
         (pDVar25->q).super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0];
    pDVar25 = (DiagDecomp<3> *)((long)pDVar25 + (ulong)bVar44 * -0x10 + 8);
    pVVar35 = (Vector<6> *)((long)pVVar35 + ((ulong)bVar44 * -2 + 1) * 8);
  }
  iVar34 = 0;
  for (; lVar42 = (long)iVar34, lVar41 != 3; lVar41 = lVar41 + 1) {
    dVar3 = l.super_Few<double,_3>.array_[lVar42];
    pdVar26 = l.super_Few<double,_3>.array_ + lVar41;
    iVar24 = (int)lVar41;
    if (dVar3 < *pdVar26 || dVar3 == *pdVar26) {
      iVar24 = iVar34;
    }
    iVar34 = iVar24;
  }
  pdVar26 = v.super_Few<double,_6>.array_ + lVar42 * 3;
  c_9.super_Few<double,_3>.array_[2] = v.super_Few<double,_6>.array_[lVar42 * 3 + 2];
  c_9.super_Few<double,_3>.array_[1] = v.super_Few<double,_6>.array_[lVar42 * 3 + 1];
  c_9.super_Few<double,_3>.array_[0] = *pdVar26;
  uVar33 = 0;
  for (lVar41 = 0; lVar41 != 3; lVar41 = lVar41 + 1) {
    uVar33 = uVar33 | (uint)(0.0 <= c_9.super_Few<double,_3>.array_[lVar41]) <<
                      ((byte)lVar41 & 0x1f);
  }
  if (uVar33 < (~uVar33 & 7)) {
    c_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] =
         v.super_Few<double,_6>.array_[lVar42 * 3 + 2];
    c_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] = *pdVar26;
    c_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] =
         v.super_Few<double,_6>.array_[lVar42 * 3 + 1];
    for (lVar41 = 0; lVar41 != 3; lVar41 = lVar41 + 1) {
      c_19.super_Few<double,_3>.array_[lVar41] =
           -c_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[lVar41];
    }
  }
  else {
    c_19.super_Few<double,_3>.array_[2] = v.super_Few<double,_6>.array_[lVar42 * 3 + 2];
    c_19.super_Few<double,_3>.array_[0] = *pdVar26;
    c_19.super_Few<double,_3>.array_[1] = v.super_Few<double,_6>.array_[lVar42 * 3 + 1];
  }
  (axis->super_Few<double,_3>).array_[2] = c_19.super_Few<double,_3>.array_[2];
  (axis->super_Few<double,_3>).array_[0] = c_19.super_Few<double,_3>.array_[0];
  (axis->super_Few<double,_3>).array_[1] = c_19.super_Few<double,_3>.array_[1];
  Write<double>::~Write(&local_148);
  Write<double>::~Write(&local_138);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_158,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
  Write<double>::Write(&local_168,&coords->write_);
  Write<double>::Write(&local_178,&masses->write_);
  center_00.super_Few<double,_3>.array_[1] = center.super_Few<double,_3>.array_[1];
  center_00.super_Few<double,_3>.array_[0] = center.super_Few<double,_3>.array_[0];
  center_00.super_Few<double,_3>.array_[2] = center.super_Few<double,_3>.array_[2];
  anon_unknown_0::mark_bisection_internal
            ((CommPtr *)this,(Reals *)&local_158,(Reals *)&local_168,tolerance,
             *(Vector<3> *)(axis->super_Few<double,_3>).array_,center_00,total_mass);
  Write<double>::~Write(&local_178);
  Write<double>::~Write(&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
  RVar66.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar66.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar66.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_bisection(
    CommPtr comm, Reals coords, Reals masses, Real tolerance, Vector<3>& axis) {
  OMEGA_H_CHECK(coords.size() == masses.size() * 3);
  auto total_mass = repro_sum(comm, masses);
  auto center = get_center(comm, coords, masses, total_mass);
  axis = get_axis(comm, coords, masses, center);
  return mark_bisection_internal(
      comm, coords, masses, tolerance, axis, center, total_mass);
}